

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  sqlite3_index_orderby *psVar1;
  sqlite3_index_constraint *psVar2;
  bool bVar3;
  sqlite3_index_orderby *pOrder;
  sqlite3_index_constraint *pCons;
  int local_40;
  int bDocid;
  int iIdx;
  int iDocidLe;
  int iDocidGe;
  int iLangidCons;
  int iCons;
  int i;
  Fts3Table *p;
  sqlite3_index_info *pInfo_local;
  sqlite3_vtab *pVTab_local;
  
  iDocidGe = -1;
  iDocidLe = -1;
  iIdx = -1;
  bDocid = -1;
  pInfo->idxNum = 0;
  pInfo->estimatedCost = 5000000.0;
  iLangidCons = 0;
  do {
    if (pInfo->nConstraint <= iLangidCons) {
      if (pInfo->idxNum == 1) {
        fts3SetUniqueFlag(pInfo);
      }
      local_40 = 1;
      if (-1 < iDocidGe) {
        local_40 = 2;
        pInfo->aConstraintUsage[iDocidGe].argvIndex = 1;
        pInfo->aConstraintUsage[iDocidGe].omit = '\x01';
      }
      if (-1 < iDocidLe) {
        pInfo->idxNum = pInfo->idxNum | 0x10000;
        pInfo->aConstraintUsage[iDocidLe].argvIndex = local_40;
        local_40 = local_40 + 1;
      }
      if (-1 < iIdx) {
        pInfo->idxNum = pInfo->idxNum | 0x20000;
        pInfo->aConstraintUsage[iIdx].argvIndex = local_40;
        local_40 = local_40 + 1;
      }
      if (-1 < bDocid) {
        pInfo->idxNum = pInfo->idxNum | 0x40000;
        pInfo->aConstraintUsage[bDocid].argvIndex = local_40;
      }
      if ((pInfo->nOrderBy == 1) &&
         ((psVar1 = pInfo->aOrderBy, psVar1->iColumn < 0 ||
          (psVar1->iColumn == *(int *)&pVTab[2].pModule + 1)))) {
        if (psVar1->desc == '\0') {
          pInfo->idxStr = "ASC";
        }
        else {
          pInfo->idxStr = "DESC";
        }
        pInfo->orderByConsumed = 1;
      }
      return 0;
    }
    psVar2 = pInfo->aConstraint + iLangidCons;
    if (psVar2->usable == '\0') {
      if (psVar2->op == '@') {
        pInfo->idxNum = 0;
        pInfo->estimatedCost = 1e+50;
        fts3SetEstimatedRows(pInfo,0x4000000000000);
        return 0;
      }
    }
    else {
      bVar3 = true;
      if (-1 < psVar2->iColumn) {
        bVar3 = psVar2->iColumn == *(int *)&pVTab[2].pModule + 1;
      }
      if (((iDocidGe < 0) && (psVar2->op == '\x02')) && (bVar3)) {
        pInfo->idxNum = 1;
        pInfo->estimatedCost = 1.0;
        iDocidGe = iLangidCons;
      }
      if (((psVar2->op == '@') && (-1 < psVar2->iColumn)) &&
         (psVar2->iColumn <= *(int *)&pVTab[2].pModule)) {
        pInfo->idxNum = psVar2->iColumn + 2;
        pInfo->estimatedCost = 2.0;
        iDocidGe = iLangidCons;
      }
      if ((psVar2->op == '\x02') && (psVar2->iColumn == *(int *)&pVTab[2].pModule + 2)) {
        iDocidLe = iLangidCons;
      }
      if (bVar3) {
        switch(psVar2->op) {
        case '\x04':
        case ' ':
          iIdx = iLangidCons;
          break;
        case '\b':
        case '\x10':
          bDocid = iLangidCons;
        }
      }
    }
    iLangidCons = iLangidCons + 1;
  } while( true );
}

Assistant:

static int fts3BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts3Table *p = (Fts3Table *)pVTab;
  int i;                          /* Iterator variable */
  int iCons = -1;                 /* Index of constraint to use */

  int iLangidCons = -1;           /* Index of langid=x constraint, if present */
  int iDocidGe = -1;              /* Index of docid>=x constraint, if present */
  int iDocidLe = -1;              /* Index of docid<=x constraint, if present */
  int iIdx;

  /* By default use a full table scan. This is an expensive option,
  ** so search through the constraints to see if a more efficient 
  ** strategy is possible.
  */
  pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
  pInfo->estimatedCost = 5000000;
  for(i=0; i<pInfo->nConstraint; i++){
    int bDocid;                 /* True if this constraint is on docid */
    struct sqlite3_index_constraint *pCons = &pInfo->aConstraint[i];
    if( pCons->usable==0 ){
      if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH ){
        /* There exists an unusable MATCH constraint. This means that if
        ** the planner does elect to use the results of this call as part
        ** of the overall query plan the user will see an "unable to use
        ** function MATCH in the requested context" error. To discourage
        ** this, return a very high cost here.  */
        pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
        pInfo->estimatedCost = 1e50;
        fts3SetEstimatedRows(pInfo, ((sqlite3_int64)1) << 50);
        return SQLITE_OK;
      }
      continue;
    }

    bDocid = (pCons->iColumn<0 || pCons->iColumn==p->nColumn+1);

    /* A direct lookup on the rowid or docid column. Assign a cost of 1.0. */
    if( iCons<0 && pCons->op==SQLITE_INDEX_CONSTRAINT_EQ && bDocid ){
      pInfo->idxNum = FTS3_DOCID_SEARCH;
      pInfo->estimatedCost = 1.0;
      iCons = i;
    }

    /* A MATCH constraint. Use a full-text search.
    **
    ** If there is more than one MATCH constraint available, use the first
    ** one encountered. If there is both a MATCH constraint and a direct
    ** rowid/docid lookup, prefer the MATCH strategy. This is done even 
    ** though the rowid/docid lookup is faster than a MATCH query, selecting
    ** it would lead to an "unable to use function MATCH in the requested 
    ** context" error.
    */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH 
     && pCons->iColumn>=0 && pCons->iColumn<=p->nColumn
    ){
      pInfo->idxNum = FTS3_FULLTEXT_SEARCH + pCons->iColumn;
      pInfo->estimatedCost = 2.0;
      iCons = i;
    }

    /* Equality constraint on the langid column */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_EQ 
     && pCons->iColumn==p->nColumn + 2
    ){
      iLangidCons = i;
    }

    if( bDocid ){
      switch( pCons->op ){
        case SQLITE_INDEX_CONSTRAINT_GE:
        case SQLITE_INDEX_CONSTRAINT_GT:
          iDocidGe = i;
          break;

        case SQLITE_INDEX_CONSTRAINT_LE:
        case SQLITE_INDEX_CONSTRAINT_LT:
          iDocidLe = i;
          break;
      }
    }
  }

  /* If using a docid=? or rowid=? strategy, set the UNIQUE flag. */
  if( pInfo->idxNum==FTS3_DOCID_SEARCH ) fts3SetUniqueFlag(pInfo);

  iIdx = 1;
  if( iCons>=0 ){
    pInfo->aConstraintUsage[iCons].argvIndex = iIdx++;
    pInfo->aConstraintUsage[iCons].omit = 1;
  } 
  if( iLangidCons>=0 ){
    pInfo->idxNum |= FTS3_HAVE_LANGID;
    pInfo->aConstraintUsage[iLangidCons].argvIndex = iIdx++;
  } 
  if( iDocidGe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_GE;
    pInfo->aConstraintUsage[iDocidGe].argvIndex = iIdx++;
  } 
  if( iDocidLe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_LE;
    pInfo->aConstraintUsage[iDocidLe].argvIndex = iIdx++;
  } 

  /* Regardless of the strategy selected, FTS can deliver rows in rowid (or
  ** docid) order. Both ascending and descending are possible. 
  */
  if( pInfo->nOrderBy==1 ){
    struct sqlite3_index_orderby *pOrder = &pInfo->aOrderBy[0];
    if( pOrder->iColumn<0 || pOrder->iColumn==p->nColumn+1 ){
      if( pOrder->desc ){
        pInfo->idxStr = "DESC";
      }else{
        pInfo->idxStr = "ASC";
      }
      pInfo->orderByConsumed = 1;
    }
  }

  assert( p->pSegments==0 );
  return SQLITE_OK;
}